

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blake3.c
# Opt level: O1

void blake3_hasher_finalize(blake3_hasher *self,uint8_t *out,size_t out_len)

{
  uint8_t uVar1;
  uint8_t *puVar2;
  ulong uVar3;
  ulong uVar4;
  blake3_hasher *pbVar5;
  uint64_t uVar6;
  size_t sVar7;
  output_t output;
  uint8_t wide_buf [64];
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 uStack_f8;
  undefined8 uStack_f0;
  uint64_t local_e8;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined8 uStack_c0;
  undefined8 uStack_b8;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  uint8_t local_a0;
  byte local_9f;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 uStack_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 uStack_68;
  undefined8 uStack_60;
  undefined8 uStack_58;
  undefined8 uStack_50;
  undefined8 uStack_48;
  undefined8 uStack_40;
  
  uVar3 = (ulong)self->cv_stack_len;
  if (uVar3 == 0) {
    local_9f = (self->chunk).blocks_compressed == '\0' | (self->chunk).flags | 2;
    local_a0 = (self->chunk).buf_len;
    local_e8 = (self->chunk).chunk_counter;
    local_108 = *(undefined8 *)(self->chunk).cv;
    uStack_100 = *(undefined8 *)((self->chunk).cv + 2);
    uStack_f8 = *(undefined8 *)((self->chunk).cv + 4);
    uStack_f0 = *(undefined8 *)((self->chunk).cv + 6);
    local_e0 = *(undefined8 *)(self->chunk).buf;
    uStack_d8 = *(undefined8 *)((self->chunk).buf + 8);
    uStack_d0 = *(undefined8 *)((self->chunk).buf + 0x10);
    uStack_c8 = *(undefined8 *)((self->chunk).buf + 0x18);
    uStack_c0 = *(undefined8 *)((self->chunk).buf + 0x20);
    uStack_b8 = *(undefined8 *)((self->chunk).buf + 0x28);
    uStack_b0 = *(undefined8 *)((self->chunk).buf + 0x30);
    uStack_a8 = *(undefined8 *)((self->chunk).buf + 0x38);
    if (out_len != 0) {
      uVar6 = 0;
      do {
        blake3_compress_xof((uint32_t *)&local_108,(uint8_t *)&local_e0,local_a0,uVar6,local_9f | 8,
                            (uint8_t *)&local_78);
        sVar7 = 0x40;
        if (out_len < 0x40) {
          sVar7 = out_len;
        }
        memcpy(out,&local_78,sVar7);
        out = out + sVar7;
        uVar6 = uVar6 + 1;
        out_len = out_len - sVar7;
      } while (out_len != 0);
    }
  }
  else {
    uVar1 = (self->chunk).blocks_compressed;
    local_a0 = (self->chunk).buf_len;
    if (uVar1 == '\0' && local_a0 == '\0') {
      uVar4 = uVar3 - 2;
      puVar2 = (self->chunk).buf + uVar3 * 0x20 + 9;
      local_9f = (self->chunk).flags | 4;
      local_a0 = '@';
      local_e8 = 0;
      pbVar5 = self;
    }
    else {
      local_9f = uVar1 == '\0' | (self->chunk).flags | 2;
      puVar2 = (self->chunk).buf;
      local_e8 = (self->chunk).chunk_counter;
      uVar4 = uVar3;
      pbVar5 = (blake3_hasher *)&self->chunk;
    }
    local_108 = *(undefined8 *)pbVar5->key;
    uStack_100 = *(undefined8 *)(pbVar5->key + 2);
    uStack_f8 = *(undefined8 *)(pbVar5->key + 4);
    uStack_f0 = *(undefined8 *)(pbVar5->key + 6);
    local_e0 = *(undefined8 *)puVar2;
    uStack_d8 = *(undefined8 *)(puVar2 + 8);
    uStack_d0 = *(undefined8 *)(puVar2 + 0x10);
    uStack_c8 = *(undefined8 *)(puVar2 + 0x18);
    uStack_c0 = *(undefined8 *)(puVar2 + 0x20);
    uStack_b8 = *(undefined8 *)(puVar2 + 0x28);
    uStack_b0 = *(undefined8 *)(puVar2 + 0x30);
    uStack_a8 = *(undefined8 *)(puVar2 + 0x38);
    if (uVar4 != 0) {
      puVar2 = self->cv_stack + uVar4 * 0x20 + -0x20;
      do {
        local_78 = *(undefined8 *)puVar2;
        uStack_70 = *(undefined8 *)(puVar2 + 8);
        uStack_68 = *(undefined8 *)(puVar2 + 0x10);
        uStack_60 = *(undefined8 *)(puVar2 + 0x18);
        local_98 = local_108;
        uStack_90 = uStack_100;
        uStack_88 = uStack_f8;
        uStack_80 = uStack_f0;
        blake3_compress_in_place
                  ((uint32_t *)&local_98,(uint8_t *)&local_e0,local_a0,local_e8,local_9f);
        uStack_58 = local_98;
        uStack_50 = uStack_90;
        uStack_48 = uStack_88;
        uStack_40 = uStack_80;
        local_9f = (self->chunk).flags | 4;
        puVar2 = puVar2 + -0x20;
        uVar4 = uVar4 - 1;
        local_108 = *(undefined8 *)self->key;
        uStack_100 = *(undefined8 *)(self->key + 2);
        uStack_f8 = *(undefined8 *)(self->key + 4);
        uStack_f0 = *(undefined8 *)(self->key + 6);
        local_e0 = local_78;
        uStack_d8 = uStack_70;
        uStack_d0 = uStack_68;
        uStack_c8 = uStack_60;
        uStack_c0 = local_98;
        uStack_b8 = uStack_90;
        uStack_b0 = uStack_88;
        uStack_a8 = uStack_80;
        local_e8 = 0;
        local_a0 = '@';
      } while (uVar4 != 0);
    }
    if (out_len != 0) {
      uVar6 = 0;
      do {
        blake3_compress_xof((uint32_t *)&local_108,(uint8_t *)&local_e0,local_a0,uVar6,local_9f | 8,
                            (uint8_t *)&local_78);
        sVar7 = 0x40;
        if (out_len < 0x40) {
          sVar7 = out_len;
        }
        memcpy(out,&local_78,sVar7);
        out = out + sVar7;
        uVar6 = uVar6 + 1;
        out_len = out_len - sVar7;
      } while (out_len != 0);
    }
  }
  return;
}

Assistant:

void blake3_hasher_finalize(const blake3_hasher *self, uint8_t *out,
                            size_t out_len) {
  // If the subtree stack is empty, then the current chunk is the root.
  if (self->cv_stack_len == 0) {
    output_t output = chunk_state_output(&self->chunk);
    output_root_bytes(&output, out, out_len);
    return;
  }
  // If there are any bytes in the chunk state, finalize that chunk and do a
  // roll-up merge between that chunk hash and every subtree in the stack. In
  // this case, the extra merge loop at the end of blake3_hasher_update
  // guarantees that none of the subtrees in the stack need to be merged with
  // each other first. Otherwise, if there are no bytes in the chunk state,
  // then the top of the stack is a chunk hash, and we start the merge from
  // that.
  output_t output;
  size_t cvs_remaining;
  if (chunk_state_len(&self->chunk) > 0) {
    cvs_remaining = self->cv_stack_len;
    output = chunk_state_output(&self->chunk);
  } else {
    // There are always at least 2 CVs in the stack in this case.
    cvs_remaining = self->cv_stack_len - 2;
    output = parent_output(&self->cv_stack[cvs_remaining * 32], self->key,
                           self->chunk.flags);
  }
  while (cvs_remaining > 0) {
    cvs_remaining -= 1;
    uint8_t parent_block[BLAKE3_BLOCK_LEN];
    memcpy(parent_block, &self->cv_stack[cvs_remaining * 32], 32);
    output_chaining_value(&output, &parent_block[32]);
    output = parent_output(parent_block, self->key, self->chunk.flags);
  }
  output_root_bytes(&output, out, out_len);
}